

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa.c
# Opt level: O2

_Bool duckdb_je_pa_shard_enable_hpa
                (tsdn_t *tsdn,pa_shard_t *shard,hpa_shard_opts_t *hpa_opts,sec_opts_t *hpa_sec_opts)

{
  _Bool _Var1;
  _Bool _Var2;
  
  _Var1 = duckdb_je_hpa_shard_init
                    (&shard->hpa_shard,&shard->central->hpa,shard->emap,shard->base,
                     &shard->edata_cache,shard->ind,hpa_opts);
  _Var2 = true;
  if (!_Var1) {
    _Var1 = duckdb_je_sec_init(tsdn,&shard->hpa_sec,shard->base,&(shard->hpa_shard).pai,hpa_sec_opts
                              );
    if (!_Var1) {
      shard->ever_used_hpa = true;
      (shard->use_hpa).repr = true;
      _Var2 = false;
    }
  }
  return _Var2;
}

Assistant:

bool
pa_shard_enable_hpa(tsdn_t *tsdn, pa_shard_t *shard,
    const hpa_shard_opts_t *hpa_opts, const sec_opts_t *hpa_sec_opts) {
	if (hpa_shard_init(&shard->hpa_shard, &shard->central->hpa, shard->emap,
	    shard->base, &shard->edata_cache, shard->ind, hpa_opts)) {
		return true;
	}
	if (sec_init(tsdn, &shard->hpa_sec, shard->base, &shard->hpa_shard.pai,
	    hpa_sec_opts)) {
		return true;
	}
	shard->ever_used_hpa = true;
	atomic_store_b(&shard->use_hpa, true, ATOMIC_RELAXED);

	return false;
}